

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::GenerateAccessorDeclarations
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedMessageFieldGenerator *this_local;
  
  if ((this->dependent_getter_ & 1U) == 0) {
    io::Printer::Print(printer,&this->variables_,
                       "$deprecated_attr$const $type$& $name$(int index) const;\n");
  }
  if ((this->dependent_field_ & 1U) == 0) {
    InternalGenerateTypeDependentAccessorDeclarations(this,printer);
  }
  if ((this->dependent_getter_ & 1U) == 0) {
    io::Printer::Print(printer,&this->variables_,
                       "$deprecated_attr$const ::google::protobuf::RepeatedPtrField< $type$ >&\n    $name$() const;\n"
                      );
  }
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateAccessorDeclarations(io::Printer* printer) const {
  if (!dependent_getter_) {
    printer->Print(variables_,
      "$deprecated_attr$const $type$& $name$(int index) const;\n");
  }
  if (!dependent_field_) {
    InternalGenerateTypeDependentAccessorDeclarations(printer);
  }
  if (!dependent_getter_) {
    printer->Print(variables_,
      "$deprecated_attr$const ::google::protobuf::RepeatedPtrField< $type$ >&\n"
      "    $name$() const;\n");
  }
}